

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delta_length_byte_array_decoder.cpp
# Opt level: O2

void __thiscall
duckdb::DeltaLengthByteArrayDecoder::InitializePage(DeltaLengthByteArrayDecoder *this)

{
  type buffer;
  runtime_error *this_00;
  idx_t i;
  idx_t iVar1;
  uint64_t req_len;
  
  if (this->reader->column_schema->field_0x29 == -0x38) {
    buffer = shared_ptr<duckdb::ResizeableBuffer,_true>::operator*(&this->reader->block);
    DeltaByteArrayDecoder::ReadDbpData
              (this->reader->reader->allocator,buffer,this->length_buffer,&this->byte_array_count);
    req_len = 0;
    for (iVar1 = 0; this->byte_array_count != iVar1; iVar1 = iVar1 + 1) {
      req_len = req_len + *(uint *)((this->length_buffer->super_ByteBuffer).ptr + iVar1 * 4);
    }
    ByteBuffer::available(&buffer->super_ByteBuffer,req_len);
    this->length_idx = 0;
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error
            (this_00,"Delta Length Byte Array encoding is only supported for string/blob data");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void DeltaLengthByteArrayDecoder::InitializePage() {
	if (reader.Type().InternalType() != PhysicalType::VARCHAR) {
		throw std::runtime_error("Delta Length Byte Array encoding is only supported for string/blob data");
	}
	// read the binary packed lengths
	auto &block = *reader.block;
	auto &allocator = reader.reader.allocator;
	DeltaByteArrayDecoder::ReadDbpData(allocator, block, length_buffer, byte_array_count);

	// Verify that the sum of DBP string lengths match up with the available string data
	idx_t total_string_length = 0;
	const auto length_data = reinterpret_cast<uint32_t *>(length_buffer.ptr);
	for (idx_t i = 0; i < byte_array_count; i++) {
		total_string_length += length_data[i];
	}
	block.available(total_string_length);

	length_idx = 0;
}